

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicAllTargetsStoreCS::Run(BasicAllTargetsStoreCS *this)

{
  bool bVar1;
  long lVar2;
  Vector<float,_4> *in_R8;
  Vector<float,_4> local_38;
  DataType local_28 [6];
  
  local_28[0] = 0xbf800000;
  local_28[1] = 0x40000000;
  local_28[2] = 0x40400000;
  local_28[3] = 0xc0800000;
  local_38.m_data[0] = -1.0;
  local_38.m_data[1] = 2.0;
  local_38.m_data[2] = 3.0;
  local_38.m_data[3] = -4.0;
  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<float,4>>
                    ((BasicAllTargetsStoreCS *)this,0,(GLenum)local_28,&local_38,in_R8);
  lVar2 = -1;
  if (bVar1) {
    local_28[0] = TYPE_FLOAT;
    local_28[1] = ~TYPE_FLOAT;
    local_28[2] = TYPE_FLOAT_VEC3;
    local_28[3] = ~TYPE_FLOAT_VEC3;
    local_38.m_data[0] = 1.4013e-45;
    local_38.m_data[1] = -NAN;
    local_38.m_data[2] = 4.2039e-45;
    local_38.m_data[3] = -NAN;
    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<int,4>>
                      ((BasicAllTargetsStoreCS *)this,0,(GLenum)local_28,(Vector<int,_4> *)&local_38
                       ,(Vector<int,_4> *)in_R8);
    if (bVar1) {
      local_28[0] = TYPE_FLOAT;
      local_28[1] = TYPE_FLOAT_VEC2;
      local_28[2] = TYPE_FLOAT_VEC3;
      local_28[3] = TYPE_FLOAT_VEC4;
      local_38.m_data[0] = 1.4013e-45;
      local_38.m_data[1] = 2.8026e-45;
      local_38.m_data[2] = 4.2039e-45;
      local_38.m_data[3] = 5.60519e-45;
      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
              Write<tcu::Vector<unsigned_int,4>>
                        ((BasicAllTargetsStoreCS *)this,0,(GLenum)local_28,
                         (Vector<unsigned_int,_4> *)&local_38,(Vector<unsigned_int,_4> *)in_R8);
      if (bVar1) {
        local_28[0] = TYPE_FLOAT;
        local_28[1] = ~TYPE_FLOAT;
        local_28[2] = TYPE_FLOAT_VEC3;
        local_28[3] = ~TYPE_FLOAT_VEC3;
        local_38.m_data[0] = 1.4013e-45;
        local_38.m_data[1] = -NAN;
        local_38.m_data[2] = 4.2039e-45;
        local_38.m_data[3] = -NAN;
        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<int,4>>
                          ((BasicAllTargetsStoreCS *)this,1,(GLenum)local_28,
                           (Vector<int,_4> *)&local_38,(Vector<int,_4> *)in_R8);
        if (bVar1) {
          local_28[0] = TYPE_FLOAT;
          local_28[1] = TYPE_FLOAT_VEC2;
          local_28[2] = TYPE_FLOAT_VEC3;
          local_28[3] = TYPE_FLOAT_VEC4;
          local_38.m_data[0] = 1.4013e-45;
          local_38.m_data[1] = 2.8026e-45;
          local_38.m_data[2] = 4.2039e-45;
          local_38.m_data[3] = 5.60519e-45;
          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                  Write<tcu::Vector<unsigned_int,4>>
                            ((BasicAllTargetsStoreCS *)this,1,(GLenum)local_28,
                             (Vector<unsigned_int,_4> *)&local_38,(Vector<unsigned_int,_4> *)in_R8);
          if (bVar1) {
            local_28[0] = 0xbf800000;
            local_28[1] = 0x40000000;
            local_28[2] = 0x40400000;
            local_28[3] = 0xc0800000;
            local_38.m_data[0] = -1.0;
            local_38.m_data[1] = 2.0;
            local_38.m_data[2] = 3.0;
            local_38.m_data[3] = -4.0;
            bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                    Write<tcu::Vector<float,4>>
                              ((BasicAllTargetsStoreCS *)this,1,(GLenum)local_28,&local_38,in_R8);
            if (bVar1) {
              local_28[0] = TYPE_FLOAT;
              local_28[1] = TYPE_FLOAT_VEC2;
              local_28[2] = TYPE_FLOAT_VEC3;
              local_28[3] = TYPE_FLOAT_VEC4;
              local_38.m_data[0] = 1.4013e-45;
              local_38.m_data[1] = 2.8026e-45;
              local_38.m_data[2] = 4.2039e-45;
              local_38.m_data[3] = 5.60519e-45;
              bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                      Write<tcu::Vector<unsigned_int,4>>
                                ((BasicAllTargetsStoreCS *)this,2,(GLenum)local_28,
                                 (Vector<unsigned_int,_4> *)&local_38,
                                 (Vector<unsigned_int,_4> *)in_R8);
              if (bVar1) {
                local_28[0] = 0xbf800000;
                local_28[1] = 0x40000000;
                local_28[2] = 0x40400000;
                local_28[3] = 0xc0800000;
                local_38.m_data[0] = -1.0;
                local_38.m_data[1] = 2.0;
                local_38.m_data[2] = 3.0;
                local_38.m_data[3] = -4.0;
                bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                        Write<tcu::Vector<float,4>>
                                  ((BasicAllTargetsStoreCS *)this,2,(GLenum)local_28,&local_38,in_R8
                                  );
                if (bVar1) {
                  local_28[0] = TYPE_FLOAT;
                  local_28[1] = ~TYPE_FLOAT;
                  local_28[2] = TYPE_FLOAT_VEC3;
                  local_28[3] = ~TYPE_FLOAT_VEC3;
                  local_38.m_data[0] = 1.4013e-45;
                  local_38.m_data[1] = -NAN;
                  local_38.m_data[2] = 4.2039e-45;
                  local_38.m_data[3] = -NAN;
                  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                          Write<tcu::Vector<int,4>>
                                    ((BasicAllTargetsStoreCS *)this,2,(GLenum)local_28,
                                     (Vector<int,_4> *)&local_38,(Vector<int,_4> *)in_R8);
                  if (bVar1) {
                    local_28[0] = 0xbf800000;
                    local_28[1] = 0x40000000;
                    local_28[2] = 0x40400000;
                    local_28[3] = 0xc0800000;
                    local_38.m_data[0] = -1.0;
                    local_38.m_data[1] = 2.0;
                    local_38.m_data[2] = 3.0;
                    local_38.m_data[3] = -4.0;
                    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                            Write<tcu::Vector<float,4>>
                                      ((BasicAllTargetsStoreCS *)this,3,(GLenum)local_28,&local_38,
                                       in_R8);
                    if (bVar1) {
                      local_28[0] = TYPE_FLOAT;
                      local_28[1] = ~TYPE_FLOAT;
                      local_28[2] = TYPE_FLOAT_VEC3;
                      local_28[3] = ~TYPE_FLOAT_VEC3;
                      local_38.m_data[0] = 1.4013e-45;
                      local_38.m_data[1] = -NAN;
                      local_38.m_data[2] = 4.2039e-45;
                      local_38.m_data[3] = -NAN;
                      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                              Write<tcu::Vector<int,4>>
                                        ((BasicAllTargetsStoreCS *)this,3,(GLenum)local_28,
                                         (Vector<int,_4> *)&local_38,(Vector<int,_4> *)in_R8);
                      if (bVar1) {
                        local_28[0] = TYPE_FLOAT;
                        local_28[1] = TYPE_FLOAT_VEC2;
                        local_28[2] = TYPE_FLOAT_VEC3;
                        local_28[3] = TYPE_FLOAT_VEC4;
                        local_38.m_data[0] = 1.4013e-45;
                        local_38.m_data[1] = 2.8026e-45;
                        local_38.m_data[2] = 4.2039e-45;
                        local_38.m_data[3] = 5.60519e-45;
                        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                                Write<tcu::Vector<unsigned_int,4>>
                                          ((BasicAllTargetsStoreCS *)this,3,(GLenum)local_28,
                                           (Vector<unsigned_int,_4> *)&local_38,
                                           (Vector<unsigned_int,_4> *)in_R8);
                        lVar2 = (ulong)bVar1 - 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{

		if (!Write(T2D, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(T2D, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2D, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		return NO_ERROR;
	}